

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVector<$9099ad00$>::SmallVector
          (SmallVector<_9099ad00_> *this,SmallVector<_9099ad00_> *RHS)

{
  bool bVar1;
  SmallVector<_9099ad00_> *RHS_local;
  SmallVector<_9099ad00_> *this_local;
  
  SmallVectorImpl<$1ba91462$>::SmallVectorImpl(&this->super_SmallVectorImpl<_1ba91462_>,10);
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)RHS);
  if (!bVar1) {
    SmallVectorImpl<$1ba91462$>::operator=
              (&this->super_SmallVectorImpl<_1ba91462_>,&RHS->super_SmallVectorImpl<_1ba91462_>);
  }
  return;
}

Assistant:

SmallVector(const SmallVector &RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(RHS);
  }